

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<unsigned_int>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  uint min_value;
  uint max_value;
  FilterPropagateResult FVar1;
  uint32_t constant;
  Value *this_00;
  Value *pVVar2;
  undefined7 in_register_00000011;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr_iterator<duckdb::Value> local_48;
  
  pVVar2 = constants.ptr;
  min_value = *(uint *)(this + 0x30);
  max_value = *(uint *)(this + 0x40);
  local_48.index = 0;
  if (pVVar2 != (Value *)0x0) {
    local_48.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
    local_48.size = (idx_t)pVVar2;
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_48);
      constant = Value::GetValueUnsafe<unsigned_int>(this_00);
      FVar1 = CheckZonemapTemplated<unsigned_int>
                        ((BaseStatistics *)this,(ExpressionType)stats,min_value,max_value,constant);
      if (FVar1 < FILTER_ALWAYS_FALSE) {
        return FVar1;
      }
      local_48.index = (idx_t)&((LogicalType *)local_48.index)->physical_type_;
      if (local_48.size <= local_48.index) {
        local_48.index = local_48.size;
      }
    } while (((local_48.ptr != (Value *)CONCAT71(in_register_00000011,comparison_type)) ||
             ((Value *)local_48.index != pVVar2)) || ((Value *)local_48.size != pVVar2));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

uint32_t GetNumericValueUnion::Operation(const NumericValueUnion &v) {
	return v.value_.uinteger;
}